

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typed_expression.cc
# Opt level: O2

int __thiscall
tchecker::typed_ite_expression_t::clone
          (typed_ite_expression_t *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  typed_expression_t *ptVar1;
  typed_ite_expression_t *this_00;
  shared_ptr<const_tchecker::typed_expression_t> else_value_clone;
  shared_ptr<const_tchecker::typed_expression_t> then_value_clone;
  shared_ptr<const_tchecker::typed_expression_t> condition_clone;
  
  ptVar1 = condition(this);
  ptVar1 = (typed_expression_t *)(**(code **)(*(long *)ptVar1 + 0x28))(ptVar1);
  std::__shared_ptr<tchecker::typed_expression_t_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<tchecker::typed_expression_t,void>
            ((__shared_ptr<tchecker::typed_expression_t_const,(__gnu_cxx::_Lock_policy)2> *)
             &condition_clone,ptVar1);
  ptVar1 = then_value(this);
  ptVar1 = (typed_expression_t *)(**(code **)(*(long *)ptVar1 + 0x28))(ptVar1);
  std::__shared_ptr<tchecker::typed_expression_t_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<tchecker::typed_expression_t,void>
            ((__shared_ptr<tchecker::typed_expression_t_const,(__gnu_cxx::_Lock_policy)2> *)
             &then_value_clone,ptVar1);
  ptVar1 = else_value(this);
  ptVar1 = (typed_expression_t *)(**(code **)(*(long *)ptVar1 + 0x28))(ptVar1);
  std::__shared_ptr<tchecker::typed_expression_t_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<tchecker::typed_expression_t,void>
            ((__shared_ptr<tchecker::typed_expression_t_const,(__gnu_cxx::_Lock_policy)2> *)
             &else_value_clone,ptVar1);
  this_00 = (typed_ite_expression_t *)operator_new(0x48);
  typed_ite_expression_t
            (this_00,(this->super_typed_expression_t)._type,&condition_clone,&then_value_clone,
             &else_value_clone);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&else_value_clone.
              super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&then_value_clone.
              super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&condition_clone.
              super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return (int)this_00;
}

Assistant:

tchecker::typed_ite_expression_t * typed_ite_expression_t::clone() const
{
  std::shared_ptr<tchecker::typed_expression_t const> condition_clone{condition().clone()};
  std::shared_ptr<tchecker::typed_expression_t const> then_value_clone{then_value().clone()};
  std::shared_ptr<tchecker::typed_expression_t const> else_value_clone{else_value().clone()};
  return new tchecker::typed_ite_expression_t(_type, condition_clone, then_value_clone, else_value_clone);
}